

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gms_matcher.h
# Opt level: O2

int __thiscall
gms_matcher::GetInlierMask
          (gms_matcher *this,vector<bool,_std::allocator<bool>_> *vbInliers,bool WithScale,
          bool WithRotation)

{
  int iVar1;
  int iVar2;
  int RotationType_1;
  int iVar3;
  int RotationType;
  int iVar4;
  
  if (WithScale || WithRotation) {
    if (WithScale && WithRotation) {
      iVar3 = 0;
      for (iVar4 = 0; iVar4 != 5; iVar4 = iVar4 + 1) {
        SetScale(this,iVar4);
        for (iVar2 = 1; iVar2 != 9; iVar2 = iVar2 + 1) {
          iVar1 = run(this,iVar2);
          if (iVar3 < iVar1) {
            std::vector<bool,_std::allocator<bool>_>::operator=(vbInliers,&this->mvbInlierMask);
            iVar3 = iVar1;
          }
        }
      }
    }
    else {
      iVar3 = 0;
      if (WithRotation && !WithScale) {
        SetScale(this,0);
        for (iVar4 = 1; iVar4 != 9; iVar4 = iVar4 + 1) {
          iVar2 = run(this,iVar4);
          if (iVar3 < iVar2) {
            std::vector<bool,_std::allocator<bool>_>::operator=(vbInliers,&this->mvbInlierMask);
            iVar3 = iVar2;
          }
        }
      }
      else if (WithScale && !WithRotation) {
        iVar3 = 0;
        for (iVar4 = 0; iVar4 != 5; iVar4 = iVar4 + 1) {
          SetScale(this,iVar4);
          iVar2 = run(this,1);
          if (iVar3 < iVar2) {
            std::vector<bool,_std::allocator<bool>_>::operator=(vbInliers,&this->mvbInlierMask);
            iVar3 = iVar2;
          }
        }
      }
    }
  }
  else {
    SetScale(this,0);
    iVar3 = run(this,1);
    std::vector<bool,_std::allocator<bool>_>::operator=(vbInliers,&this->mvbInlierMask);
  }
  return iVar3;
}

Assistant:

int gms_matcher::GetInlierMask(vector<bool> &vbInliers, bool WithScale, bool WithRotation) {

	int max_inlier = 0;

	if (!WithScale && !WithRotation)
	{
		SetScale(0);
		max_inlier = run(1);
		vbInliers = mvbInlierMask;
		return max_inlier;
	}

	if (WithRotation && WithScale)
	{
		for (int Scale = 0; Scale < 5; Scale++)
		{
			SetScale(Scale);
			for (int RotationType = 1; RotationType <= 8; RotationType++)
			{
				int num_inlier = run(RotationType);

				if (num_inlier > max_inlier)
				{
					vbInliers = mvbInlierMask;
					max_inlier = num_inlier;
				}
			}
		}
		return max_inlier;
	}

	if (WithRotation && !WithScale)
	{
		SetScale(0);
		for (int RotationType = 1; RotationType <= 8; RotationType++)
		{
			int num_inlier = run(RotationType);

			if (num_inlier > max_inlier)
			{
				vbInliers = mvbInlierMask;
				max_inlier = num_inlier;
			}
		}
		return max_inlier;
	}

	if (!WithRotation && WithScale)
	{
		for (int Scale = 0; Scale < 5; Scale++)
		{
			SetScale(Scale);

			int num_inlier = run(1);

			if (num_inlier > max_inlier)
			{
				vbInliers = mvbInlierMask;
				max_inlier = num_inlier;
			}
			
		}
		return max_inlier;
	}

	return max_inlier;
}